

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O1

int fctkern__pass_filter(fctkern_t *nk,char *test_name)

{
  size_t sVar1;
  char *pcVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  bool bVar7;
  bool bVar8;
  
  if (nk == (fctkern_t *)0x0) {
    __assert_fail("nk != __null && \"invalid arg\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x8b9
                  ,"int fctkern__pass_filter(fctkern_t *, const char *)");
  }
  if (test_name == (char *)0x0) {
    __assert_fail("test_name != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x8ba
                  ,"int fctkern__pass_filter(fctkern_t *, const char *)");
  }
  if (*test_name == '\0') {
    __assert_fail("strlen(test_name) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x8bb
                  ,"int fctkern__pass_filter(fctkern_t *, const char *)");
  }
  sVar1 = (nk->prefix_list).used_itm_num;
  iVar3 = 1;
  if (sVar1 != 0) {
    sVar5 = 0;
    do {
      pcVar6 = (char *)(nk->prefix_list).itm_list[sVar5];
      if (pcVar6 == (char *)0x0) {
        return 1;
      }
      if (*pcVar6 == '\0') {
        return 1;
      }
      pcVar4 = test_name;
      if (*test_name == '\0') {
        bVar8 = false;
        bVar7 = false;
      }
      else {
        bVar7 = *pcVar6 == *test_name;
        pcVar2 = test_name + 1;
        if (bVar7) {
          do {
            pcVar4 = pcVar2;
            pcVar6 = pcVar6 + 1;
            bVar8 = *pcVar6 == '\0';
            if ((bVar8) || (*pcVar4 == '\0')) break;
            bVar7 = *pcVar6 == *pcVar4;
            pcVar2 = pcVar4 + 1;
          } while (bVar7);
        }
        else {
          bVar8 = false;
        }
      }
      if ((bVar7) && (bVar8 || *pcVar4 != '\0')) {
        return 1;
      }
      sVar5 = sVar5 + 1;
    } while (sVar5 != sVar1);
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static nbool_t
fctkern__pass_filter(fctkern_t *nk, char const *test_name)
{
    size_t prefix_i =0;
    size_t prefix_list_size =0;
    FCT_ASSERT( nk != NULL && "invalid arg");
    FCT_ASSERT( test_name != NULL );
    FCT_ASSERT( strlen(test_name) > 0 );
    prefix_list_size = fctkern__filter_cnt(nk);
    /* If there is no filter list, then we return FCT_TRUE always. */
    if ( prefix_list_size == 0 )
    {
        return FCT_TRUE;
    }
    /* Iterate through the prefix filter list, and see if we have
    anything that does not pass. All we require is ONE item that
    passes the test in order for us to succeed here. */
    for ( prefix_i = 0; prefix_i != prefix_list_size; ++prefix_i )
    {
        char const *prefix = (char const*)fct_nlist__at(
                                 &(nk->prefix_list), prefix_i
                             );
        nbool_t pass = fct_filter_pass(prefix, test_name);
        if ( pass )
        {
            return FCT_TRUE;
        }
    }
    /* Otherwise, we never managed to find a prefix that satisfied the
    supplied test name. Therefore we have failed to pass to the filter
    list test. */
    return FCT_FALSE;
}